

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

pointer __thiscall
google::protobuf::RepeatedField<unsigned_int>::AddNAlreadyReserved
          (RepeatedField<unsigned_int> *this,int n)

{
  int iVar1;
  int v2;
  LogMessage *pLVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  uint *end;
  uint *begin;
  uint *p;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  string *local_28;
  string *absl_log_internal_check_op_result;
  int capacity;
  int old_size;
  bool is_soo;
  RepeatedField<unsigned_int> *pRStack_10;
  int n_local;
  RepeatedField<unsigned_int> *this_local;
  
  old_size = n;
  pRStack_10 = this;
  capacity._3_1_ = RepeatedField<unsigned_int>::is_soo(this);
  absl_log_internal_check_op_result._4_4_ = size(this,(bool)capacity._3_1_);
  absl_log_internal_check_op_result._0_4_ = Capacity(this,(bool)(capacity._3_1_ & 1));
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                    ((int)absl_log_internal_check_op_result -
                     absl_log_internal_check_op_result._4_4_);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(old_size);
  local_28 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_
                       (iVar1,v2,"capacity - old_size >= n");
  if (local_28 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x306,auVar4._0_8_,auVar4._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(int)absl_log_internal_check_op_result);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [3])0x603bb2)
    ;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,absl_log_internal_check_op_result._4_4_);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  puVar3 = unsafe_elements(this,(bool)(capacity._3_1_ & 1));
  iVar1 = ExchangeCurrentSize(this,(bool)(capacity._3_1_ & 1),
                              absl_log_internal_check_op_result._4_4_ + old_size);
  puVar3 = puVar3 + iVar1;
  for (end = puVar3; end != puVar3 + old_size; end = end + 1) {
  }
  return puVar3;
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_ATTRIBUTE_UNUSED const int capacity = Capacity(is_soo);
  ABSL_DCHECK_GE(capacity - old_size, n) << capacity << ", " << old_size;
  Element* p =
      unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + n);
  for (Element *begin = p, *end = p + n; begin != end; ++begin) {
    new (static_cast<void*>(begin)) Element;
  }
  return p;
}